

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O3

int dfft_create_plan_common
              (dfft_plan *p,int ndim,int *gdim,int *inembed,int *oembed,int *pdim,int *pidx,
              int row_m,int input_cyclic,int output_cyclic,MPI_Comm comm,int *proc_map,int device)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *__dest;
  ulong uVar6;
  plan_t *ppVar7;
  int **ppiVar8;
  int **ppiVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  size_t sVar21;
  size_t size;
  int nump;
  
  p->comm = comm;
  MPI_Comm_size(comm,&nump);
  if ((nump & nump - 1U) != 0) {
    return 4;
  }
  sVar11 = (long)nump << 2;
  piVar3 = (int *)malloc(sVar11);
  p->proc_map = piVar3;
  memcpy(piVar3,proc_map,sVar11);
  lVar12 = (long)ndim;
  sVar21 = lVar12 * 4;
  piVar3 = (int *)malloc(sVar21);
  p->pdim = piVar3;
  piVar4 = (int *)malloc(sVar21);
  p->gdim = piVar4;
  piVar5 = (int *)malloc(sVar21);
  p->pidx = piVar5;
  piVar5 = (int *)malloc(sVar21);
  p->inembed = piVar5;
  __dest = (int *)malloc(sVar21);
  p->oembed = __dest;
  p->ndim = ndim;
  if (ndim < 1) {
LAB_001015ea:
    if (oembed == (int *)0x0) {
      if (0 < ndim) goto LAB_0010160d;
    }
    else if (0 < ndim) {
LAB_001015f5:
      memcpy(__dest,oembed,(ulong)(uint)ndim << 2);
    }
  }
  else {
    uVar10 = (ulong)(uint)ndim;
    uVar6 = 0;
    do {
      uVar17 = gdim[uVar6];
      piVar4[uVar6] = uVar17;
      if ((uVar17 & uVar17 - 1) != 0) {
        return 5;
      }
      piVar3[uVar6] = pdim[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
    if (inembed == (int *)0x0) {
      if (0 < ndim) {
        uVar6 = 0;
        do {
          piVar5[uVar6] = piVar4[uVar6] / piVar3[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      goto LAB_001015ea;
    }
    if (ndim < 1) goto LAB_001015ea;
    memcpy(piVar5,inembed,uVar10 << 2);
    if (oembed != (int *)0x0) goto LAB_001015f5;
LAB_0010160d:
    uVar6 = 0;
    do {
      __dest[uVar6] = piVar4[uVar6] / piVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)ndim != uVar6);
  }
  piVar3 = (int *)malloc(sVar11);
  p->offset_send = piVar3;
  piVar3 = (int *)malloc(sVar11);
  p->offset_recv = piVar3;
  piVar3 = (int *)malloc(sVar11);
  p->nsend = piVar3;
  piVar3 = (int *)malloc(sVar11);
  p->nrecv = piVar3;
  if (device == 0) {
    sVar11 = lVar12 * 0x18;
    ppVar7 = (plan_t *)malloc(sVar11);
    p->plans_short_forward = ppVar7;
    ppVar7 = (plan_t *)malloc(sVar11);
    p->plans_long_forward = ppVar7;
    ppVar7 = (plan_t *)malloc(sVar11);
    p->plans_short_inverse = ppVar7;
    ppVar7 = (plan_t *)malloc(sVar11);
    p->plans_long_inverse = ppVar7;
  }
  iVar2 = *gdim;
  iVar20 = *pdim;
  *piVar5 = iVar2 / iVar20;
  *__dest = iVar2 / iVar20;
  if (ndim < 1) {
    iVar2 = 1;
    iVar20 = 1;
  }
  else {
    iVar20 = 1;
    uVar6 = 0;
    iVar2 = 1;
    do {
      iVar20 = iVar20 * piVar5[uVar6];
      iVar2 = iVar2 * __dest[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)ndim != uVar6);
  }
  p->size_in = iVar20;
  p->size_out = iVar2;
  piVar3 = (int *)malloc(sVar21);
  p->k0 = piVar3;
  if (0 < ndim) {
    uVar6 = 0;
    do {
      uVar10 = (long)gdim[uVar6] / (long)pdim[uVar6];
      uVar17 = 1;
      iVar2 = (int)uVar10;
      uVar1 = gdim[uVar6];
      if (1 < iVar2) {
        while (uVar17 = uVar1, iVar2 < (int)uVar17) {
          uVar1 = (uint)((ulong)uVar17 / (uVar10 & 0xffffffff));
        }
      }
      piVar3[uVar6] = uVar17;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)ndim);
  }
  sVar21 = lVar12 << 3;
  ppiVar8 = (int **)malloc(sVar21);
  p->rho_L = ppiVar8;
  ppiVar9 = (int **)malloc(sVar21);
  p->rho_pk0 = ppiVar9;
  ppiVar9 = (int **)malloc(sVar21);
  p->rho_Lk0 = ppiVar9;
  if (0 < ndim) {
    uVar6 = 0;
    do {
      iVar2 = pdim[uVar6];
      uVar10 = (long)gdim[uVar6] / (long)iVar2;
      iVar13 = (int)uVar10;
      piVar3 = (int *)malloc((long)iVar13 << 2);
      ppiVar8[uVar6] = piVar3;
      piVar3 = (int *)malloc((ulong)((long)iVar2 << 2) / (ulong)(long)p->k0[uVar6]);
      p->rho_pk0[uVar6] = piVar3;
      piVar3 = (int *)malloc((ulong)((long)iVar13 << 2) / (ulong)(long)p->k0[uVar6]);
      p->rho_Lk0[uVar6] = piVar3;
      ppiVar8 = p->rho_L;
      piVar3 = ppiVar8[uVar6];
      if (iVar13 == 1) {
        *piVar3 = 0;
      }
      else if (0 < iVar13) {
        uVar14 = 0;
        do {
          iVar2 = 0;
          iVar18 = 1;
          uVar15 = uVar14 & 0xffffffff;
          do {
            uVar17 = (uint)uVar15;
            uVar15 = uVar15 >> 1;
            iVar2 = (uVar17 & 1) + iVar2 * 2;
            iVar18 = iVar18 * 2;
          } while (iVar18 < iVar13);
          piVar3[uVar14] = iVar2;
          uVar14 = uVar14 + 1;
        } while (uVar14 != (uVar10 & 0xffffffff));
      }
      piVar3 = p->k0;
      uVar14 = (long)pdim[uVar6] / (long)piVar3[uVar6];
      piVar4 = p->rho_pk0[uVar6];
      iVar2 = (int)uVar14;
      if (iVar2 == 1) {
        *piVar4 = 0;
      }
      else if (0 < iVar2) {
        uVar15 = 0;
        do {
          iVar16 = 0;
          iVar18 = 1;
          uVar19 = uVar15 & 0xffffffff;
          do {
            uVar17 = (uint)uVar19;
            uVar19 = uVar19 >> 1;
            iVar16 = (uVar17 & 1) + iVar16 * 2;
            iVar18 = iVar18 * 2;
          } while (iVar18 < iVar2);
          piVar4[uVar15] = iVar16;
          uVar15 = uVar15 + 1;
        } while (uVar15 != (uVar14 & 0xffffffff));
      }
      uVar10 = (long)((ulong)(uint)(iVar13 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
               (long)piVar3[uVar6];
      piVar3 = p->rho_Lk0[uVar6];
      iVar2 = (int)uVar10;
      if (iVar2 == 1) {
        *piVar3 = 0;
      }
      else if (0 < iVar2) {
        uVar14 = 0;
        do {
          iVar13 = 0;
          iVar18 = 1;
          uVar15 = uVar14 & 0xffffffff;
          do {
            uVar17 = (uint)uVar15;
            uVar15 = uVar15 >> 1;
            iVar13 = (uVar17 & 1) + iVar13 * 2;
            iVar18 = iVar18 * 2;
          } while (iVar18 < iVar2);
          piVar3[uVar14] = iVar13;
          uVar14 = uVar14 + 1;
        } while (uVar14 != (uVar10 & 0xffffffff));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)ndim);
    if (0 < ndim) {
      piVar3 = p->pidx;
      uVar6 = 0;
      do {
        piVar3[uVar6] = pidx[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)ndim != uVar6);
    }
  }
  if (device != 0) {
    return 2;
  }
  iVar2 = dfft_init_local_fft();
  if (iVar2 != 0) {
    return 1;
  }
  p->dfft_multi = 0;
  p->device = 0;
  if (0 < ndim) {
    piVar3 = p->inembed;
    uVar6 = 0;
    do {
      iVar13 = (gdim[uVar6] / pdim[uVar6]) * (iVar20 / piVar3[uVar6]);
      iVar2 = iVar13 / p->k0[uVar6];
      dfft_create_1d_plan(p->plans_short_forward + uVar6,p->k0[uVar6],1,iVar2,1,iVar2,1,0);
      iVar2 = iVar13 / p->k0[uVar6];
      dfft_create_1d_plan(p->plans_short_inverse + uVar6,p->k0[uVar6],1,iVar2,1,iVar2,1,1);
      iVar2 = gdim[uVar6] / pdim[uVar6];
      iVar13 = iVar13 / iVar2;
      dfft_create_1d_plan(p->plans_long_forward + uVar6,iVar2,1,iVar13,1,iVar13,1,0);
      dfft_create_1d_plan(p->plans_long_inverse + uVar6,iVar2,1,iVar13,1,iVar13,1,1);
      piVar3 = p->inembed;
      iVar20 = (iVar20 / piVar3[uVar6]) * p->oembed[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)ndim);
    if (0 < ndim) {
      iVar2 = 1;
      uVar6 = 0;
      do {
        iVar20 = p->oembed[uVar6];
        if (p->oembed[uVar6] < p->inembed[uVar6]) {
          iVar20 = p->inembed[uVar6];
        }
        iVar2 = iVar2 * iVar20;
        uVar6 = uVar6 + 1;
      } while ((uint)ndim != uVar6);
      goto LAB_00101b55;
    }
  }
  iVar2 = 1;
LAB_00101b55:
  p->scratch_size = iVar2;
  size = (long)iVar2 << 3;
  dfft_allocate_aligned_memory(&p->scratch,size);
  dfft_allocate_aligned_memory(&p->scratch_2,size);
  dfft_allocate_aligned_memory(&p->scratch_3,size);
  p->input_cyclic = input_cyclic;
  p->output_cyclic = output_cyclic;
  p->row_m = row_m;
  p->init = 1;
  return 0;
}

Assistant:

int dfft_create_plan_common(dfft_plan *p,
    int ndim, int *gdim,
    int *inembed, int *oembed,
    int *pdim, int *pidx, int row_m,
    int input_cyclic, int output_cyclic,
    MPI_Comm comm,
    int *proc_map,
    int device)
    {
    int s,nump;

    p->comm = comm;

    MPI_Comm_size(comm,&nump);

    /* number of processor must be power of two */
    if (nump & (nump-1)) return 4;

    /* Allocate memory for processor map and copy over */
    p->proc_map = malloc(sizeof(int)*nump);
    memcpy(p->proc_map, proc_map, sizeof(int)*nump);

    p->pdim = malloc(ndim*sizeof(int));
    p->gdim = malloc(ndim*sizeof(int));
    p->pidx = malloc(ndim*sizeof(int));

    p->inembed = malloc(ndim*sizeof(int));
    p->oembed = malloc(ndim*sizeof(int));

    p->ndim = ndim;

    int i;
    for (i = 0; i < ndim; i++)
        {
        p->gdim[i] = gdim[i];

        /* Every dimension must be a power of two */
        if (gdim[i] & (gdim[i]-1)) return 5;

        p->pdim[i] = pdim[i];
        }

    if (inembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = inembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = p->gdim[i]/p->pdim[i];
        }

    if (oembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = oembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = p->gdim[i]/p->pdim[i];
        }

    p->offset_send = (int *)malloc(sizeof(int)*nump);
    p->offset_recv = (int *)malloc(sizeof(int)*nump);
    p->nsend = (int *)malloc(sizeof(int)*nump);
    p->nrecv = (int *)malloc(sizeof(int)*nump);

    if (!device)
        {
        #ifdef ENABLE_HOST
        p->plans_short_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_long_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_short_inverse = malloc(sizeof(plan_t)*ndim);
        p->plans_long_inverse = malloc(sizeof(plan_t)*ndim);
        #else
        return 3;
        #endif
        }

    /* local problem size */
    int size_in = 1;
    int size_out = 1;

    /* since we expect column-major input, the leading dimension
      has no embedding */
    p->inembed[0] = gdim[0]/pdim[0];
    p->oembed[0] = gdim[0]/pdim[0];

    for (i = 0; i < ndim ; ++i)
        {
        size_in *= p->inembed[i];
        size_out *= p->oembed[i];
        }

    p->size_in = size_in;
    p->size_out = size_out;

    /* find length k0 of last stage of butterflies */
    p->k0 = malloc(sizeof(int)*ndim);

    for (i = 0; i< ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        if (length > 1)
            {
            int c;
            for (c=gdim[i]; c>length; c /= length)
                ;
            p->k0[i] = c;
            }
        else
            {
            p->k0[i] = 1;
            }
        }

    p->rho_L = (int **)malloc(ndim*sizeof(int *));
    p->rho_pk0= (int **)malloc(ndim*sizeof(int *));
    p->rho_Lk0 = (int **)malloc(ndim*sizeof(int *));

    for (i = 0; i < ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        p->rho_L[i] = (int *) malloc(sizeof(int)*length);
        p->rho_pk0[i] = (int *) malloc(sizeof(int)*pdim[i]/(p->k0[i]));
        p->rho_Lk0[i] = (int *) malloc(sizeof(int)*length/(p->k0[i]));
        bitrev_init(length, p->rho_L[i]);
        bitrev_init(pdim[i]/(p->k0[i]),p->rho_pk0[i]);
        bitrev_init(length/(p->k0[i]),p->rho_Lk0[i]);
        }

    /* processor coordinates */
    for (i = 0; i < ndim; ++i)
        {
        p->pidx[i] = pidx[i];
        }

    /* init local FFT library */
    int res;
    if (!device)
        {
        #ifdef ENABLE_HOST
        res = dfft_init_local_fft();
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        res = dfft_cuda_init_local_fft();
        #else
        return 2;
        #endif
        }

    if (res) return 1;

    int size = size_in;

    p->dfft_multi = 0;

    p->device = device;

    if (device)
        {
        /* use multidimensional local transforms */
        dfft_create_execution_flow(p);

        /* allocate storage for variables */
        int dmax = p->max_depth + 2;
        p->rev_j1 = (int **) malloc(sizeof(int *)*dmax);
        p->rev_global = (int **) malloc(sizeof(int *)*dmax);
        p->rev_partial = (int **) malloc(sizeof(int *)*dmax);
        p->c0 = (int **) malloc(sizeof(int *)*dmax);
        p->c1 = (int **) malloc(sizeof(int *)*dmax);
        int d;
        for (d = 0; d < dmax; ++d)
            {
            p->rev_j1[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_global[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_partial[d] = (int *) malloc(sizeof(int)*ndim);
            p->c0[d] = (int *) malloc(sizeof(int)*ndim);
            p->c1[d] = (int *) malloc(sizeof(int)*ndim);
            }

        p->dfft_multi = 1;
        }
    else
        {
        for (i = 0; i < ndim; ++i)
            {
            /* plan for short-distance butterflies */
            int st = size/p->inembed[i]*(gdim[i]/pdim[i]);

            #ifdef ENABLE_HOST
            int howmany = 1;
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/(p->k0[i]);
            #endif
            dfft_create_1d_plan(&(p->plans_short_forward[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 0);
            dfft_create_1d_plan(&(p->plans_short_inverse[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 1);

            /* plan for long-distance butterflies */
            int length = gdim[i]/pdim[i];
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/length;
            #endif
            dfft_create_1d_plan(&(p->plans_long_forward[i]), length,
                howmany, st/length,1, st/length,1, 0);
            dfft_create_1d_plan(&(p->plans_long_inverse[i]), length,
                howmany, st/length,1, st/length,1, 1);
            #else
            return 3;
            #endif

            size /= p->inembed[i];
            size *= p->oembed[i];
            }
        }

    /* Allocate scratch space */
    int scratch_size = 1;
    for (i = 0; i < ndim; ++i)
        scratch_size *= ((p->inembed[i] > p->oembed[i]) ? p->inembed[i]  : p->oembed[i]);
    p->scratch_size = scratch_size;

    if (!device)
        {
        #ifdef ENABLE_HOST
        dfft_allocate_aligned_memory(&(p->scratch),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_2),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_3),sizeof(cpx_t)*scratch_size);
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_2),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_3),sizeof(cuda_cpx_t)*scratch_size);
        #else
        return 2;
        #endif
        }

    p->input_cyclic = input_cyclic;
    p->output_cyclic = output_cyclic;

    #ifdef ENABLE_CUDA
    #ifndef NDEBUG
    p->check_cuda_errors = 1;
    #else
    p->check_cuda_errors = 0;
    #endif
    #endif

    p->row_m = row_m;

    /* before plan creation is complete, an initialization run will
     * be performed */
    p->init = 1;

    return 0;
    }